

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::cleanupDraw(RenderTarget *this,RenderStates *states)

{
  socklen_t in_EDX;
  
  if (states->shader != (Shader *)0x0) {
    Shader::bind(0,(sockaddr *)states,in_EDX);
  }
  if ((states->texture != (Texture *)0x0) && (states->texture->m_fboAttachment == true)) {
    applyTexture(this,(Texture *)0x0);
  }
  (this->m_cache).enable = true;
  return;
}

Assistant:

void RenderTarget::cleanupDraw(const RenderStates& states)
{
    // Unbind the shader, if any
    if (states.shader)
        applyShader(NULL);

    // If the texture we used to draw belonged to a RenderTexture, then forcibly unbind that texture.
    // This prevents a bug where some drivers do not clear RenderTextures properly.
    if (states.texture && states.texture->m_fboAttachment)
        applyTexture(NULL);

    // Re-enable the cache at the end of the draw if it was disabled
    m_cache.enable = true;
}